

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

void bloaty::wasm::ParseSections(RangeSink *sink)

{
  string_view name;
  string_view local_80;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  size_t local_60;
  string_view local_48;
  
  local_80._M_len = (sink->file_->data_)._M_len;
  local_80._M_str = (sink->file_->data_)._M_str;
  ReadMagic(&local_80);
  while (local_80._M_len != 0) {
    Section::Read((Section *)local_70,&local_80);
    name._M_str = local_68._M_p;
    name._M_len = local_60;
    RangeSink::AddFileRange(sink,"wasm_sections",name,local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void ParseSections(RangeSink* sink) {
  ForEachSection(sink->input_file().data(), [sink](const Section& section) {
    sink->AddFileRange("wasm_sections", section.name, section.data);
  });
}